

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

void __thiscall pbrt::ThreadPool::WorkOrWait(ThreadPool *this,unique_lock<std::mutex> *lock)

{
  ParallelJob *this_00;
  bool bVar1;
  int iVar2;
  ParallelJob **ppPVar3;
  
  ppPVar3 = &this->jobList;
  while( true ) {
    this_00 = *ppPVar3;
    if (this_00 == (ParallelJob *)0x0) {
      std::condition_variable::wait((unique_lock *)&this->jobListCondition);
      return;
    }
    iVar2 = (*this_00->_vptr_ParallelJob[2])(this_00);
    if ((char)iVar2 != '\0') break;
    ppPVar3 = &this_00->next;
  }
  this_00->activeWorkers = this_00->activeWorkers + 1;
  (*this_00->_vptr_ParallelJob[3])(this_00,lock);
  std::unique_lock<std::mutex>::lock(lock);
  this_00->activeWorkers = this_00->activeWorkers + -1;
  bVar1 = ParallelJob::Finished(this_00);
  if (bVar1) {
    std::condition_variable::notify_all();
    return;
  }
  return;
}

Assistant:

void ThreadPool::WorkOrWait(std::unique_lock<std::mutex> *lock) {
    DCHECK(lock->owns_lock());

    ParallelJob *job = jobList;
    while ((job != nullptr) && !job->HaveWork())
        job = job->next;
    if (job != nullptr) {
        // Execute work for _job_
        job->activeWorkers++;
        job->RunStep(lock);
        DCHECK(!lock->owns_lock());
        lock->lock();
        job->activeWorkers--;
        if (job->Finished())
            jobListCondition.notify_all();

    } else
        // Wait for new work to arrive or the job to finish
        jobListCondition.wait(*lock);
}